

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downsize.cpp
# Opt level: O2

int downsize(string *f_input,string *f_output)

{
  pointer pbVar1;
  char cVar2;
  long lVar3;
  istream *piVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  int iVar7;
  pointer pbVar8;
  uint uVar9;
  uint uVar10;
  ulong local_4e0;
  string n;
  string local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string line;
  ofstream w_file;
  ifstream r_file;
  
  std::ifstream::ifstream(&r_file,(string *)f_input,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar6 = std::operator<<((ostream *)&std::cout,"Error: File ");
    poVar6 = std::operator<<(poVar6,(string *)f_input);
    poVar6 = std::operator<<(poVar6," does not exist");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    lVar3 = std::__cxx11::string::find((char *)f_input,0x10611a);
    if ((((lVar3 != -1) ||
         (lVar3 = std::__cxx11::string::find((char *)f_input,0x10611f), lVar3 != -1)) ||
        (lVar3 = std::__cxx11::string::find((char *)f_input,0x106124), lVar3 != -1)) ||
       (lVar3 = std::__cxx11::string::find((char *)f_input,0x106129), lVar3 != -1)) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      content.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      content.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      content.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&r_file,(string *)&line),
            ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
        std::__cxx11::string::string((string *)&local_4b8,(string *)&line);
        trim((string *)&w_file,&local_4b8);
        lVar3 = std::__cxx11::string::find((char *)&w_file,0x106155);
        if (lVar3 == -1) {
          lVar3 = std::__cxx11::string::find((char *)&w_file,0x106158);
          if ((lVar3 == -1) || (downsize_line(std::__cxx11::string)::header != '\x01')) {
            lVar3 = std::__cxx11::string::find((char *)&w_file,0x10615b);
            if ((lVar3 == -1) && (*_w_file != '#')) {
              if (downsize_line(std::__cxx11::string)::header != '\x01') {
                std::__cxx11::string::_M_assign((string *)&local_4b8);
                n._M_dataplus._M_p = (pointer)0x0;
                n._M_string_length = 0;
                n.field_2._M_allocated_capacity = 0;
                while (local_4e0 = std::__cxx11::string::find((char *)&local_4b8,0x10615e),
                      local_4e0 != 0xffffffffffffffff) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&n,&local_4e0)
                  ;
                }
                uVar9 = 0;
                for (p_Var5 = dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left;
                    (_Rb_tree_header *)p_Var5 !=
                    &dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
                    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                  local_4e0 = std::__cxx11::string::find((string *)&local_4b8,(ulong)(p_Var5 + 1));
                  while (local_4e0 != 0xffffffffffffffff) {
                    for (uVar10 = 0;
                        (ulong)uVar10 <
                        (ulong)((long)(n._M_string_length - (long)n._M_dataplus._M_p) >> 3);
                        uVar10 = uVar10 + 1) {
                      if (local_4e0 <
                          *(long *)(n._M_dataplus._M_p + (ulong)uVar10 * 8) - (ulong)uVar9) {
                        if ((uVar10 & 1) != 0) goto LAB_00104e3c;
                        break;
                      }
                    }
                    if (p_Var5[2]._M_parent == (_Base_ptr)0x0) {
                      std::__cxx11::string::erase((ulong)&local_4b8,local_4e0);
                      uVar9 = uVar9 + 1;
                    }
                    else {
                      std::__cxx11::string::replace
                                ((ulong)&local_4b8,local_4e0,(string *)p_Var5[1]._M_parent);
                    }
LAB_00104e3c:
                    local_4e0 = std::__cxx11::string::find((string *)&local_4b8,(ulong)(p_Var5 + 1))
                    ;
                  }
                }
                std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                          ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&n);
                goto LAB_00104ca9;
              }
              std::operator+(&n,&local_4b8,'\n');
            }
            else {
              std::operator+(&n,&local_4b8,'\n');
            }
          }
          else {
            downsize_line(std::__cxx11::string)::header = '\0';
            std::operator+(&n,&local_4b8,'\n');
          }
          std::__cxx11::string::operator=((string *)&local_4b8,(string *)&n);
          std::__cxx11::string::~string((string *)&n);
        }
        else {
          if (downsize_line(std::__cxx11::string)::first_header == '\x01') {
            std::operator+(&n,'\n',&local_4b8);
            std::__cxx11::string::operator=((string *)&local_4b8,(string *)&n);
            std::__cxx11::string::~string((string *)&n);
          }
          lVar3 = std::__cxx11::string::find((char *)&w_file,0x106158);
          if (lVar3 == -1) {
            downsize_line(std::__cxx11::string)::header = '\x01';
          }
          downsize_line(std::__cxx11::string)::first_header = '\x01';
        }
LAB_00104ca9:
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p == &local_4b8.field_2) {
          local_478.field_2._8_8_ = local_4b8.field_2._8_8_;
        }
        else {
          local_478._M_dataplus._M_p = local_4b8._M_dataplus._M_p;
        }
        local_478.field_2._M_allocated_capacity._1_7_ =
             local_4b8.field_2._M_allocated_capacity._1_7_;
        local_478.field_2._M_local_buf[0] = local_4b8.field_2._M_local_buf[0];
        local_478._M_string_length = local_4b8._M_string_length;
        local_4b8._M_string_length = 0;
        local_4b8.field_2._M_local_buf[0] = '\0';
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        std::__cxx11::string::~string((string *)&w_file);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&content,
                   &local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_4b8);
      }
      std::ifstream::close();
      std::ofstream::ofstream(&w_file,(string *)f_output,_S_trunc|_S_in);
      pbVar1 = content.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = content.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&n,(string *)pbVar8);
        std::operator<<((ostream *)&w_file,(string *)&n);
        std::__cxx11::string::~string((string *)&n);
      }
      std::ofstream::close();
      std::ofstream::~ofstream(&w_file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&content);
      std::__cxx11::string::~string((string *)&line);
      iVar7 = 0;
      goto LAB_00104f54;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Error: File extension is not supported");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ifstream::close();
  }
  iVar7 = 1;
LAB_00104f54:
  std::ifstream::~ifstream(&r_file);
  return iVar7;
}

Assistant:

int downsize(const std::string f_input, const std::string f_output) {
    std::ifstream r_file(f_input, std::ios::out);
    if (!r_file.is_open()) {
        std::cout << "Error: File " << f_input << " does not exist" << std::endl;
        return EXIT_FAILURE;
    }
    if (
            (f_input.find(".sqf") == std::string::npos) &&
            (f_input.find(".hpp") == std::string::npos) &&
            (f_input.find(".ext") == std::string::npos) &&
            (f_input.find(".cpp") == std::string::npos)
        ) {
        std::cout << "Error: File extension is not supported" << std::endl;
        r_file.close();
        return EXIT_FAILURE;
    }

    std::string line;
    std::vector<std::string> content;
    while (getline(r_file, line)) {
        content.push_back(downsize_line(line));
    }
    r_file.close();

    std::ofstream w_file(f_output, std::ios::in | std::ios::trunc);
    for (std::string n : content) {
        w_file << n;
    }
    w_file.close();

    return EXIT_SUCCESS;
}